

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Stop_Freeze_R_PDU::Encode(Stop_Freeze_R_PDU *this,KDataStream *stream)

{
  Simulation_Management_Header::Encode((Simulation_Management_Header *)this,stream);
  (*(this->super_Stop_Freeze_PDU).m_RealWorldTime.super_DataTypeBase._vptr_DataTypeBase[5])
            (&(this->super_Stop_Freeze_PDU).m_RealWorldTime,stream);
  KDataStream::Write(stream,(this->super_Stop_Freeze_PDU).m_ui8Reason);
  KDataStream::Write(stream,(this->super_Stop_Freeze_PDU).m_ui8FrozenBehaviour);
  KDataStream::Write(stream,(this->super_Reliability_Header).m_ui8ReqRelSrv);
  KDataStream::Write(stream,(this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.
                            super_Header.super_Header6.m_ui8Padding2);
  KDataStream::Write<unsigned_int>(stream,(this->super_Stop_Freeze_PDU).m_ui32RequestID);
  return;
}

Assistant:

void Stop_Freeze_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << KDIS_STREAM m_RealWorldTime
           << m_ui8Reason
           << m_ui8FrozenBehaviour
           << m_ui8ReqRelSrv
           << m_ui8Padding2
           << m_ui32RequestID;
}